

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

void __thiscall
QDockAreaLayout::tabifyDockWidget(QDockAreaLayout *this,QDockWidget *first,QDockWidget *second)

{
  int index;
  QDockAreaLayoutInfo *this_00;
  QLayoutItem *dockWidgetItem;
  long in_FS_OFFSET;
  QString local_60;
  QList<int> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  indexOf(&local_48,this,&first->super_QWidget);
  if ((undefined1 *)local_48.d.size != (undefined1 *)0x0) {
    this_00 = info(this,&local_48);
    index = local_48.d.ptr[(long)(local_48.d.size + -1)];
    dockWidgetItem = (QLayoutItem *)operator_new(0x18);
    QDockWidgetItem::QDockWidgetItem((QDockWidgetItem *)dockWidgetItem,second);
    QDockAreaLayoutInfo::tab(this_00,index,dockWidgetItem);
    QObject::objectName();
    removePlaceHolder(this,&local_60);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayout::tabifyDockWidget(QDockWidget *first, QDockWidget *second)
{
    const QList<int> path = indexOf(first);
    if (path.isEmpty())
        return;

    QDockAreaLayoutInfo *info = this->info(path);
    Q_ASSERT(info != nullptr);
    info->tab(path.last(), new QDockWidgetItem(second));

    removePlaceHolder(second->objectName());
}